

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::DataDictionaryMessageTest_TestToString_Test::TestBody
          (DataDictionaryMessageTest_TestToString_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  DataDictionaryMessageTest_TestToString_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  bidfx_public_api::price::pixie::DataDictionaryMessage::ToString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[697],std::__cxx11::string>
            ((EqHelper<false> *)local_20,
             "\"DataDictionary(update=false, fields=[\\n\" \"  fieldDef(FID=0, name=\\\"Bid\\\", type=DOUBLE, encoding=VARINT, scale=6)\\n\" \"  fieldDef(FID=1, name=\\\"Ask\\\", type=DOUBLE, encoding=VARINT, scale=6)\\n\" \"  fieldDef(FID=2, name=\\\"BidSize\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=3, name=\\\"AskSize\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=4, name=\\\"BidTime\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=5, name=\\\"AskTime\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=6, name=\\\"OrderQuantity\\\", type=DOUBLE, encoding=VARINT, scale=2)\\n\" \"  fieldDef(FID=9, name=\\\"NetChange\\\", type=DOUBLE, encoding=ZIGZAG, scale=4)\\n\" \"  fieldDef(FID=10, name=\\\"PercentChange\\\", type=DOUBLE, encoding=ZIGZAG, scale=2)\\n\" \"])\""
             ,"data_dict_message->ToString()",
             (char (*) [697])
             "DataDictionary(update=false, fields=[\n  fieldDef(FID=0, name=\"Bid\", type=DOUBLE, encoding=VARINT, scale=6)\n  fieldDef(FID=1, name=\"Ask\", type=DOUBLE, encoding=VARINT, scale=6)\n  fieldDef(FID=2, name=\"BidSize\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=3, name=\"AskSize\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=4, name=\"BidTime\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=5, name=\"AskTime\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=6, name=\"OrderQuantity\", type=DOUBLE, encoding=VARINT, scale=2)\n  fieldDef(FID=9, name=\"NetChange\", type=DOUBLE, encoding=ZIGZAG, scale=4)\n  fieldDef(FID=10, name=\"PercentChange\", type=DOUBLE, encoding=ZIGZAG, scale=2)\n])"
             ,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/data_dictionary_message_test.cpp"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(DataDictionaryMessageTest, TestToString)
{
    ASSERT_EQ("DataDictionary(update=false, fields=[\n"
                 "  fieldDef(FID=0, name=\"Bid\", type=DOUBLE, encoding=VARINT, scale=6)\n"
                 "  fieldDef(FID=1, name=\"Ask\", type=DOUBLE, encoding=VARINT, scale=6)\n"
                 "  fieldDef(FID=2, name=\"BidSize\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=3, name=\"AskSize\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=4, name=\"BidTime\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=5, name=\"AskTime\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=6, name=\"OrderQuantity\", type=DOUBLE, encoding=VARINT, scale=2)\n"
                 "  fieldDef(FID=9, name=\"NetChange\", type=DOUBLE, encoding=ZIGZAG, scale=4)\n"
                 "  fieldDef(FID=10, name=\"PercentChange\", type=DOUBLE, encoding=ZIGZAG, scale=2)\n"
                 "])", data_dict_message->ToString());
}